

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O2

uint64_t unodb::detail::
         key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
         ::make_u64(key_view k1,
                   basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> shifted_k2,
                   tree_depth<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>_>
                   depth)

{
  ulong uVar1;
  uint64_t uVar2;
  ulong uVar3;
  ulong uVar4;
  size_t __n;
  ulong local_40;
  uint64_t u;
  
  u = shifted_k2.field_0._0_8_;
  uVar3 = k1._M_extent._M_extent_value._M_extent_value - (ulong)depth.value;
  local_40 = 0;
  if (7 < uVar3) {
    uVar3 = 8;
  }
  memcpy(&local_40,k1._M_ptr + depth.value,uVar3);
  uVar3 = local_40;
  local_40 = 0;
  __n = 8;
  if (shifted_k2.field_0._8_8_ < 8) {
    __n = shifted_k2.field_0._8_8_;
  }
  memcpy(&local_40,(void *)u,__n);
  uVar4 = local_40 ^ uVar3 & 0xffffffffffffff | 0x100000000000000;
  uVar1 = 0;
  if (uVar4 != 0) {
    for (; (uVar4 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
    }
  }
  uVar2 = length_to_word((uint)(uVar1 >> 3) & 0x1fffffff);
  return uVar2 | uVar3 & 0xffffffffffffff;
}

Assistant:

[[nodiscard, gnu::const]] static constexpr std::uint64_t make_u64(
      key_view k1, ArtKey shifted_k2, tree_depth<ArtKey> depth) noexcept {
    k1 = k1.subspan(depth);  // shift_right(depth)

    const auto k1_u64 = get_u64(k1) & key_bytes_mask;

    return k1_u64 | length_to_word(shared_len(k1_u64, shifted_k2.get_u64(),
                                              key_prefix_capacity));
  }